

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O2

void ngx_chain_update_chains
               (ngx_pool_t *p,ngx_chain_t **free,ngx_chain_t **busy,ngx_chain_t **out,
               ngx_buf_tag_t tag)

{
  ngx_chain_t *pnVar1;
  ngx_buf_t *pnVar2;
  long lVar3;
  ngx_chain_t **ppnVar4;
  ngx_chain_t *pnVar5;
  
  if (*out != (ngx_chain_t *)0x0) {
    ppnVar4 = busy;
    pnVar1 = *busy;
    if (*busy != (ngx_chain_t *)0x0) {
      do {
        pnVar5 = pnVar1;
        pnVar1 = pnVar5->next;
      } while (pnVar1 != (ngx_chain_t *)0x0);
      ppnVar4 = &pnVar5->next;
    }
    *ppnVar4 = *out;
    *out = (ngx_chain_t *)0x0;
  }
  while( true ) {
    pnVar1 = *busy;
    if (pnVar1 == (ngx_chain_t *)0x0) {
      return;
    }
    pnVar2 = pnVar1->buf;
    if ((pnVar2->field_0x48 & 7) == 0) {
      lVar3 = pnVar2->file_last - pnVar2->file_pos;
    }
    else {
      lVar3 = (long)pnVar2->last - (long)pnVar2->pos;
    }
    if (lVar3 != 0) break;
    ppnVar4 = &p->chain;
    if (pnVar2->tag == tag) {
      pnVar2->pos = pnVar2->start;
      pnVar2->last = pnVar2->start;
      ppnVar4 = free;
    }
    *busy = pnVar1->next;
    pnVar1->next = *ppnVar4;
    *ppnVar4 = pnVar1;
  }
  return;
}

Assistant:

void
ngx_chain_update_chains(ngx_pool_t *p, ngx_chain_t **free, ngx_chain_t **busy,
    ngx_chain_t **out, ngx_buf_tag_t tag)
{
    ngx_chain_t  *cl;

    if (*out) {
        if (*busy == NULL) {
            *busy = *out;

        } else {
            for (cl = *busy; cl->next; cl = cl->next) { /* void */ }

            cl->next = *out;
        }

        *out = NULL;
    }

    while (*busy) {
        cl = *busy;

        if (ngx_buf_size(cl->buf) != 0) {
            break;
        }

        if (cl->buf->tag != tag) {
            *busy = cl->next;
            ngx_free_chain(p, cl);
            continue;
        }

        cl->buf->pos = cl->buf->start;
        cl->buf->last = cl->buf->start;

        *busy = cl->next;
        cl->next = *free;
        *free = cl;
    }
}